

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

_Bool ray_2D_intersect(ray_2D r1,ray_2D r2,float *t1,float *t2)

{
  mat4 mat;
  mat4 mi;
  undefined1 in_stack_000001b0 [64];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  
  mat4_inverse((mat4)in_stack_000001b0);
  local_68 = r2.orig.x;
  uStack_64 = r2.orig.y;
  local_78 = r1.orig.x;
  uStack_74 = r1.orig.y;
  *t1 = local_4c * 0.0 +
        local_50 * 0.0 + local_58 * (local_68 - local_78) + local_54 * (uStack_64 - uStack_74);
  *t2 = local_3c * 0.0 +
        local_40 * 0.0 + local_48 * (local_68 - local_78) + (uStack_64 - uStack_74) * local_44;
  return true;
}

Assistant:

bool ray_2D_intersect(struct ray_2D r1, struct ray_2D r2, float *t1, float *t2) {
    mat4 m = mat4_create(r1.dir.x, -r2.dir.x, 0.0f, 0.0f,
            r1.dir.y, -r2.dir.y, 0.0f, 0.0f,
            0.0f, 0.0f, 1.0f, 0.0f,
            0.0f, 0.0f, 0.0f, 1.0f);
    mat4 mi = mat4_inverse(m);
    vec4 v = vec4_create(r2.orig.x - r1.orig.x, r2.orig.y - r1.orig.y, 0.0f, 0.0f);
    vec4 t_v = vec4_apply_mat(v, mi);
    *t1 = t_v.x;
    *t2 = t_v.y;
    return true;
}